

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O0

void __thiscall libchars::edit_object::del(edit_object *this)

{
  size_t sVar1;
  char *p;
  size_t L;
  edit_object *this_local;
  
  sVar1 = this->buflen;
  if (this->insert_idx < this->buflen) {
    if (this->insert_idx < this->buflen - 1) {
      memmove(this->buffer + this->insert_idx,this->buffer + this->insert_idx + 1,
              (this->buflen - 1) - this->insert_idx);
    }
    this->buffer[this->buflen - 1] = '\0';
    this->buflen = this->buflen - 1;
  }
  if ((sVar1 != 0) && (this->buflen == 0)) {
    (*this->_vptr_edit_object[2])();
  }
  return;
}

Assistant:

virtual void del()
        {
            size_t L = buflen;
            if (insert_idx < buflen) {
                if (insert_idx < (buflen-1)) {
                    memmove(buffer+insert_idx, buffer+insert_idx+1, buflen-1-insert_idx);
                }
                volatile char *p = buffer + buflen - 1;
                *p = 0;
                --buflen;
            }
            if (L > 0 && buflen == 0)
                emptied();
        }